

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O3

string * __thiscall
libtorrent::print_entry_abi_cxx11_
          (string *__return_storage_ptr__,libtorrent *this,bdecode_node *e,bool single_line,
          int indent)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int64_t iVar4;
  size_t sVar5;
  long lVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  undefined7 in_register_00000009;
  long lVar8;
  ulong uVar9;
  string_view str_00;
  string_view str_01;
  string ret;
  char str [100];
  char indent_str [200];
  byte local_1c0;
  pointer local_1b8;
  size_type local_1b0;
  char local_1a8;
  uint7 uStack_1a7;
  undefined8 uStack_1a0;
  char *local_198;
  string local_190;
  string *local_170;
  undefined1 local_168 [16];
  pointer local_158;
  pointer local_148;
  undefined2 local_f8;
  undefined1 auStack_f6 [197];
  undefined1 local_31;
  
  memset(&local_f8,0x20,200);
  local_f8 = 0xa2c;
  local_31 = 0;
  if ((uint)CONCAT71(in_register_00000009,single_line) < 0xc5) {
    *(undefined1 *)((CONCAT71(in_register_00000009,single_line) & 0xffffffff) + 2 + (long)&local_f8)
         = 0;
  }
  local_1b8 = &local_1a8;
  local_1b0 = 0;
  local_1a8 = '\0';
  lVar8 = (long)*(int *)(this + 0x2c);
  if (lVar8 == -1) {
switchD_0018e258_caseD_0:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"none","");
    goto LAB_0018e65e;
  }
  uVar1 = *(ulong *)(*(long *)(this + 0x18) + lVar8 * 8);
  uVar9 = uVar1 >> 0x1d & 7;
  if ((uint)uVar9 < 5) {
    local_1c0 = (byte)e;
    switch(uVar9) {
    case 0:
      goto switchD_0018e258_caseD_0;
    case 1:
      std::__cxx11::string::push_back((char)&local_1b8);
      local_170 = __return_storage_ptr__;
      iVar2 = anon_unknown_10::line_longer_than((bdecode_node *)this,200);
      local_1c0 = iVar2 != -1 | local_1c0;
      if (local_1c0 == 0) {
        std::__cxx11::string::append((char *)&local_1b8);
      }
      local_198 = (char *)((long)&local_f8 + 1);
      iVar2 = bdecode_node::dict_size((bdecode_node *)this);
      if (0 < iVar2) {
        if (local_1c0 != 0) {
          local_198 = " ";
        }
        iVar2 = 0;
        do {
          if (iVar2 == 0 && local_1c0 == 1) {
            std::__cxx11::string::push_back((char)(anon_unknown_10 *)&local_1b8);
          }
          bdecode_node::dict_at
                    ((pair<boost::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node>
                      *)local_168,(bdecode_node *)this,iVar2);
          str_01.len_ = 1;
          str_01.ptr_ = (char *)local_168._8_8_;
          anon_unknown_10::print_string
                    ((anon_unknown_10 *)&local_1b8,(string *)local_168._0_8_,str_01,SUB41(indent,0))
          ;
          std::__cxx11::string::append((char *)&local_1b8);
          print_entry_abi_cxx11_
                    (&local_190,(libtorrent *)&local_158,(bdecode_node *)((ulong)e & 0xff),
                     (bool)(single_line + '\x02'),indent);
          std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_190._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
          }
          bdecode_node::dict_size((bdecode_node *)this);
          std::__cxx11::string::append((char *)&local_1b8);
          if (local_158 != (pointer)0x0) {
            operator_delete(local_158,(long)local_148 - (long)local_158);
          }
          iVar2 = iVar2 + 1;
          iVar3 = bdecode_node::dict_size((bdecode_node *)this);
        } while (iVar2 < iVar3);
      }
      std::__cxx11::string::push_back((char)&local_1b8);
      break;
    case 2:
      std::__cxx11::string::push_back((char)&local_1b8);
      local_170 = __return_storage_ptr__;
      iVar2 = anon_unknown_10::line_longer_than((bdecode_node *)this,200);
      local_1c0 = iVar2 != -1 | local_1c0;
      if (local_1c0 == 0) {
        std::__cxx11::string::append((char *)&local_1b8);
      }
      local_198 = (char *)((long)&local_f8 + 1);
      iVar2 = bdecode_node::list_size((bdecode_node *)this);
      if (0 < iVar2) {
        if (local_1c0 != 0) {
          local_198 = " ";
        }
        iVar2 = 0;
        do {
          if (iVar2 == 0 && local_1c0 == 1) {
            std::__cxx11::string::push_back((char)&local_1b8);
          }
          bdecode_node::list_at((bdecode_node *)local_168,(bdecode_node *)this,iVar2);
          print_entry_abi_cxx11_
                    (&local_190,(libtorrent *)local_168,(bdecode_node *)((ulong)e & 0xff),
                     (bool)(single_line + '\x02'),indent);
          std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_190._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
          }
          if ((string *)local_168._0_8_ != (string *)0x0) {
            operator_delete((void *)local_168._0_8_,(long)local_158 - local_168._0_8_);
          }
          bdecode_node::list_size((bdecode_node *)this);
          std::__cxx11::string::append((char *)&local_1b8);
          iVar2 = iVar2 + 1;
          iVar3 = bdecode_node::list_size((bdecode_node *)this);
        } while (iVar2 < iVar3);
      }
      std::__cxx11::string::push_back((char)&local_1b8);
      break;
    case 3:
      lVar6 = (uVar1 >> 0x3d) + (ulong)((uint)uVar1 & 0x1fffffff);
      str_00.ptr_ = (long)(int)(((*(uint *)(*(long *)(this + 0x18) + 8 + lVar8 * 8) & 0x1fffffff) -
                                (int)lVar6) + -2);
      str_00.len_._0_1_ = local_1c0;
      str_00.len_._1_7_ = 0;
      anon_unknown_10::print_string
                ((anon_unknown_10 *)&local_1b8,(string *)(*(long *)(this + 0x20) + lVar6 + 2),str_00
                 ,SUB41(indent,0));
      paVar7 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar7;
      goto LAB_0018e602;
    case 4:
      iVar4 = bdecode_node::int_value((bdecode_node *)this);
      snprintf(local_168,100,"%ld",iVar4);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      sVar5 = strlen(local_168);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,local_168,local_168 + sVar5);
      goto LAB_0018e65e;
    }
    paVar7 = &local_170->field_2;
    (local_170->_M_dataplus)._M_p = (pointer)paVar7;
    __return_storage_ptr__ = local_170;
LAB_0018e602:
    if (local_1b8 == &local_1a8) {
      paVar7->_M_allocated_capacity = CONCAT71(uStack_1a7,local_1a8);
      *(undefined8 *)((long)paVar7 + 8) = uStack_1a0;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_1b8;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_1a7,local_1a8);
    }
    __return_storage_ptr__->_M_string_length = local_1b0;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = (ulong)uStack_1a7 << 8;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_1a0;
    __return_storage_ptr__->_M_string_length = 0;
  }
  local_1b8 = &local_1a8;
  local_1b0 = 0;
  local_1a8 = '\0';
LAB_0018e65e:
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,CONCAT71(uStack_1a7,local_1a8) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string print_entry(bdecode_node const& e
		, bool single_line, int indent)
	{
		char indent_str[200];
		using std::memset;
		memset(indent_str, ' ', 200);
		indent_str[0] = ',';
		indent_str[1] = '\n';
		indent_str[199] = 0;
		if (indent < 197 && indent >= 0) indent_str[indent + 2] = 0;
		std::string ret;
		switch (e.type())
		{
			case bdecode_node::none_t: return "none";
			case bdecode_node::int_t:
			{
				char str[100];
				std::snprintf(str, sizeof(str), "%" PRId64, e.int_value());
				return str;
			}
			case bdecode_node::string_t:
			{
				print_string(ret, e.string_value(), single_line);
				return ret;
			}
			case bdecode_node::list_t:
			{
				ret += '[';
				bool one_liner = line_longer_than(e, 200) != -1 || single_line;

				if (!one_liner) ret += indent_str + 1;
				for (int i = 0; i < e.list_size(); ++i)
				{
					if (i == 0 && one_liner) ret += ' ';
					ret += print_entry(e.list_at(i), single_line, indent + 2);
					if (i < e.list_size() - 1) ret += (one_liner ? ", " : indent_str);
					else ret += (one_liner ? " " : indent_str + 1);
				}
				ret += ']';
				return ret;
			}
			case bdecode_node::dict_t:
			{
				ret += '{';
				bool one_liner = line_longer_than(e, 200) != -1 || single_line;

				if (!one_liner) ret += indent_str + 1;
				for (int i = 0; i < e.dict_size(); ++i)
				{
					if (i == 0 && one_liner) ret += ' ';
					std::pair<string_view, bdecode_node> ent = e.dict_at(i);
					print_string(ret, ent.first, true);
					ret += ": ";
					ret += print_entry(ent.second, single_line, indent + 2);
					if (i < e.dict_size() - 1) ret += (one_liner ? ", " : indent_str);
					else ret += (one_liner ? " " : indent_str + 1);
				}
				ret += '}';
				return ret;
			}
		}
		return ret;
	}